

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall ON_Viewport::SetFrustumNearFar(ON_Viewport *this,double *box_min,double *box_max)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  double *pdVar7;
  bool bVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  pdVar11 = box_min;
  if (box_min == (double *)0x0) {
    pdVar11 = box_max;
  }
  if (box_max == (double *)0x0) {
    box_max = box_min;
  }
  if ((((((pdVar11 != (double *)0x0) && (bVar4 = ON_IsValid(*pdVar11), bVar4)) &&
        (bVar4 = ON_IsValid(pdVar11[1]), bVar4)) &&
       (((bVar4 = ON_IsValid(pdVar11[2]), bVar4 && (bVar4 = ON_IsValid(*box_max), bVar4)) &&
        ((bVar4 = ON_IsValid(box_max[1]), bVar4 &&
         ((bVar4 = ON_IsValid(box_max[2]), bVar4 && (*pdVar11 < *box_max || *pdVar11 == *box_max))))
        )))) && (pdVar11[1] < box_max[1] || pdVar11[1] == box_max[1])) &&
     ((pdVar11[2] < box_max[2] || pdVar11[2] == box_max[2] && (this->m_bValidCamera == true)))) {
    dVar14 = -1.0;
    bVar4 = false;
    dVar13 = -1.0;
    pdVar7 = pdVar11;
    bVar3 = true;
    do {
      bVar5 = bVar3;
      bVar3 = false;
      pdVar9 = pdVar11;
      bVar2 = true;
      do {
        bVar6 = bVar2;
        bVar2 = false;
        pdVar10 = pdVar11;
        dVar16 = dVar13;
        bVar1 = true;
        do {
          bVar8 = bVar1;
          dVar15 = ((this->m_CamLoc).z - pdVar10[2]) * (this->m_CamZ).z +
                   ((this->m_CamLoc).y - pdVar9[1]) * (this->m_CamZ).y +
                   ((this->m_CamLoc).x - *pdVar7) * (this->m_CamZ).x;
          dVar13 = dVar15;
          if ((!bVar2 && (!bVar3 && !bVar4)) ||
             ((dVar16 <= dVar15 && (dVar13 = dVar16, dVar14 < dVar15)))) {
            dVar14 = dVar15;
          }
          bVar2 = true;
          pdVar10 = box_max;
          dVar16 = dVar13;
          bVar1 = false;
        } while (bVar8);
        bVar3 = true;
        pdVar9 = box_max;
        bVar2 = false;
      } while (bVar6);
      bVar4 = true;
      pdVar7 = box_max;
      bVar3 = false;
    } while (bVar5);
    bVar4 = ON_IsValid(dVar14);
    if (((bVar4) && (bVar4 = ON_IsValid(dVar13), bVar4)) && (0.0 < dVar14)) {
      dVar14 = dVar14 * 1.0625;
      uVar12 = -(ulong)(0.0 < dVar13 * 0.9375);
      dVar13 = (double)(uVar12 & (ulong)(dVar13 * 0.9375) |
                       ~uVar12 & (ulong)(dVar14 * this->m__MIN_NEAR_OVER_FAR));
      if (this->m_projection != perspective_view) {
        bVar4 = SetFrustumNearFar(this,dVar13,dVar14);
        return bVar4;
      }
      bVar4 = SetFrustumNearFar(this,dVar13,dVar14,this->m__MIN_NEAR_DIST,this->m__MIN_NEAR_OVER_FAR
                                ,(dVar13 + dVar14) * 0.5,0.0);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool ON_Viewport::SetFrustumNearFar( 
       const double* box_min,
       const double* box_max
       )
{
  bool rc = false;
  const double* box[2];
  int i,j,k;
  double n, f, d;
  double camLoc[3], camZ[3], P[3];

  if ( !box_min )
    box_min = box_max;
  if ( !box_max )
    box_max = box_min;
  if ( !box_min )
    return false;

  // 31 May 2007 Dale Lear RR 25980
  //    Add validation of box_min and box_max.
  if ( !ON_IsValid(box_min[0]) || !ON_IsValid(box_min[1]) || !ON_IsValid(box_min[2]) )
    return false;
  if ( !ON_IsValid(box_max[0]) || !ON_IsValid(box_max[1]) || !ON_IsValid(box_max[2]) )
    return false;
  if (    box_min[0] > box_max[0]
       || box_min[1] > box_max[1]
       || box_min[2] > box_max[2]
     )
  {
    return false;
  }
  box[0] = box_min;
  box[1] = box_max;

  if ( GetCameraFrame( camLoc, nullptr, nullptr, camZ ) ) {
    n = f = -1.0;
    for(i=0;i<2;i++)for(j=0;j<2;j++)for(k=0;k<2;k++) {
      P[0] = box[i][0];
      P[1] = box[j][1];
      P[2] = box[k][2];
      d = clipDist(camLoc,camZ,P);
      if (!i&&!j&&!k)
        n=f=d;
      else if ( d < n )
        n = d;
      else if ( d > f )
        f = d;
    }
    if ( !ON_IsValid(f) || !ON_IsValid(n) )
      return false;
    if ( f <= 0.0 )
      return false; // box is behind camera
    n *= 0.9375;
    f *= 1.0625;
    if ( n <= 0.0 )
      n = m__MIN_NEAR_OVER_FAR*f;
    if ( IsPerspectiveProjection() )
      rc = SetFrustumNearFar( n, f, m__MIN_NEAR_DIST, m__MIN_NEAR_OVER_FAR, 0.5*(n+f) );
    else
      rc = SetFrustumNearFar( n, f );
  }
  return rc;
}